

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock_test.cc
# Opt level: O2

void btree_reverse_iterator_test(void)

{
  btree_result bVar1;
  filemgr_ops *ops;
  btree_kv_ops *kv_ops;
  btree_blk_ops *blk_ops;
  ulong uVar2;
  uint64_t uVar3;
  char *__format;
  long lVar4;
  long lVar5;
  bool bVar6;
  filemgr_open_result fVar7;
  uint64_t v;
  uint64_t k;
  btree_kv_ops *local_1d0;
  filemgr *local_1c8;
  btree_iterator bi;
  btree btree;
  btreeblk_handle bhandle;
  timeval __test_begin;
  filemgr_config config;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  system("rm -rf  btreeblock_testfile");
  memleak_start();
  config.flag = 0;
  config.chunksize = 0;
  config.prefetch_duration = 0;
  config.encryption_key.bytes[0] = '\0';
  config.encryption_key.bytes[1] = '\0';
  config.encryption_key.bytes[2] = '\0';
  config.encryption_key.bytes[3] = '\0';
  config.encryption_key.bytes[4] = '\0';
  config.encryption_key.bytes[5] = '\0';
  config.encryption_key.bytes[6] = '\0';
  config.encryption_key.bytes[7] = '\0';
  config.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  config.do_not_cache_doc_blocks = false;
  config._89_3_ = 0;
  config.num_blocks_readahead = 0;
  config.encryption_key.bytes[0x18] = '\0';
  config.encryption_key.bytes[0x19] = '\0';
  config.encryption_key.bytes[0x1a] = '\0';
  config.encryption_key.bytes[0x1b] = '\0';
  config.encryption_key.bytes[0x1c] = '\0';
  config.encryption_key.bytes[0x1d] = '\0';
  config.encryption_key.bytes[0x1e] = '\0';
  config.encryption_key.bytes[0x1f] = '\0';
  config.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  config.encryption_key.bytes[8] = '\0';
  config.encryption_key.bytes[9] = '\0';
  config.encryption_key.bytes[10] = '\0';
  config.encryption_key.bytes[0xb] = '\0';
  config.encryption_key.bytes[0xc] = '\0';
  config.encryption_key.bytes[0xd] = '\0';
  config.encryption_key.bytes[0xe] = '\0';
  config.encryption_key.bytes[0xf] = '\0';
  config.encryption_key.bytes[0x10] = '\0';
  config.encryption_key.bytes[0x11] = '\0';
  config.encryption_key.bytes[0x12] = '\0';
  config.encryption_key.bytes[0x13] = '\0';
  config.encryption_key.bytes[0x14] = '\0';
  config.encryption_key.bytes[0x15] = '\0';
  config.encryption_key.bytes[0x16] = '\0';
  config.encryption_key.bytes[0x17] = '\0';
  config.blocksize = 0x100;
  config.ncacheblock = 0;
  config.options = '\b';
  config.seqtree_opt = '\0';
  config._18_6_ = 0;
  config.num_wal_shards = 8;
  config.num_bcache_shards = 0;
  config.encryption_key.algorithm = 0;
  ops = get_filemgr_ops();
  fVar7 = filemgr_open("./btreeblock_testfile",ops,&config,(err_log_callback *)0x0);
  local_1c8 = fVar7.file;
  btreeblk_init(&bhandle,local_1c8,0x100);
  kv_ops = btree_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  blk_ops = btreeblk_get_ops();
  local_1d0 = kv_ops;
  btree_init(&btree,&bhandle,blk_ops,kv_ops,0x100,'\b','\b',0,(btree_meta *)0x0);
  lVar4 = 0x1e;
  uVar3 = 0xa000000000000;
  uVar2 = 0xa00000000000;
  lVar5 = -0x6000000000000000;
  while (bVar6 = lVar4 != 0, lVar4 = lVar4 + -1, bVar6) {
    k = (uVar2 & 0xffff000000000000) + lVar5;
    v = uVar3;
    btree_insert(&btree,&k,&v);
    btreeblk_end(&bhandle);
    uVar3 = uVar3 + 0x1000000000000;
    uVar2 = uVar2 + 0x100000000000;
    lVar5 = lVar5 + 0x1000000000000000;
  }
  btree_iterator_init(&btree,&bi,(void *)0x0);
  lVar4 = 0x1e;
  uVar2 = 0xa0;
  uVar3 = 0xa00;
  do {
    bVar1 = btree_next(&bi,&k,&v);
    btreeblk_end(&bhandle);
    if (bVar1 != BTREE_RESULT_SUCCESS) {
      btree_iterator_free(&bi);
      if (lVar4 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                ,0x27e);
        btree_reverse_iterator_test()::__test_pass = 1;
        __assert_fail("c == 30",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                      ,0x27e,"void btree_reverse_iterator_test()");
      }
      k = 0x1027000000000000;
      btree_iterator_init(&btree,&bi,&k);
      while( true ) {
        bVar1 = btree_next(&bi,&k,&v);
        btreeblk_end(&bhandle);
        if (bVar1 != BTREE_RESULT_SUCCESS) break;
        k = k >> 0x38 | (k & 0xff000000000000) >> 0x28 | (k & 0xff0000000000) >> 0x18 |
            (k & 0xff00000000) >> 8 | (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
            (k & 0xff00) << 0x28 | k << 0x38;
        v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
            (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
            (v & 0xff00) << 0x28 | v << 0x38;
      }
      btree_iterator_free(&bi);
      btree_iterator_init(&btree,&bi,(void *)0x0);
      while( true ) {
        bVar1 = btree_prev(&bi,&k,&v);
        btreeblk_end(&bhandle);
        if (bVar1 != BTREE_RESULT_SUCCESS) break;
        k = k >> 0x38 | (k & 0xff000000000000) >> 0x28 | (k & 0xff0000000000) >> 0x18 |
            (k & 0xff00000000) >> 8 | (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
            (k & 0xff00) << 0x28 | k << 0x38;
        v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
            (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
            (v & 0xff00) << 0x28 | v << 0x38;
      }
      btree_iterator_free(&bi);
      k = 0x1027000000000000;
      btree_iterator_init(&btree,&bi,&k);
      lVar4 = 0x1e;
      uVar2 = 0x270;
      uVar3 = 0x2700;
      do {
        bVar1 = btree_prev(&bi,&k,&v);
        btreeblk_end(&bhandle);
        if (bVar1 != BTREE_RESULT_SUCCESS) {
          btree_iterator_free(&bi);
          if (lVar4 != 0) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                    ,0x2a7);
            btree_reverse_iterator_test()::__test_pass = 1;
            __assert_fail("c == 30",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                          ,0x2a7,"void btree_reverse_iterator_test()");
          }
          k = 0x7501000000000000;
          btree_iterator_init(&btree,&bi,&k);
          lVar4 = 0xe;
          uVar2 = 0x170;
          uVar3 = 0x1700;
          do {
            bVar1 = btree_prev(&bi,&k,&v);
            btreeblk_end(&bhandle);
            if (bVar1 != BTREE_RESULT_SUCCESS) {
              btree_iterator_free(&bi);
              if (lVar4 != 0) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                        ,0x2b7);
                btree_reverse_iterator_test()::__test_pass = 1;
                __assert_fail("c == 14",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                              ,0x2b7,"void btree_reverse_iterator_test()");
              }
              btree_iterator_init(&btree,&bi,(void *)0x0);
              uVar2 = 0xa0;
              uVar3 = 0xa00;
              while( true ) {
                if (uVar2 == 400) {
                  uVar2 = 0x170;
                  uVar3 = 0x1700;
                  while( true ) {
                    if (uVar2 == 0x100) {
                      uVar2 = 0x120;
                      uVar3 = 0x1200;
                      while( true ) {
                        if (uVar2 == 0x1c0) {
                          uVar2 = 0x1a0;
                          uVar3 = 0x1a00;
                          while( true ) {
                            if (uVar2 == 0x90) {
                              bVar1 = btree_prev(&bi,&k,&v);
                              btreeblk_end(&bhandle);
                              if (bVar1 != BTREE_RESULT_FAIL) {
                                fprintf(_stderr,"Test failed: %s %d\n",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                        ,0x2e5);
                                btree_reverse_iterator_test()::__test_pass = 1;
                                __assert_fail("br == BTREE_RESULT_FAIL",
                                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                              ,0x2e5,"void btree_reverse_iterator_test()");
                              }
                              btree_iterator_free(&bi);
                              free(local_1d0);
                              btreeblk_free(&bhandle);
                              filemgr_close(local_1c8,true,(char *)0x0,(err_log_callback *)0x0);
                              filemgr_shutdown();
                              memleak_end();
                              __format = "%s PASSED\n";
                              if (btree_reverse_iterator_test()::__test_pass != '\0') {
                                __format = "%s FAILED\n";
                              }
                              fprintf(_stderr,__format,"btree reverse iterator test");
                              return;
                            }
                            bVar1 = btree_prev(&bi,&k,&v);
                            if (bVar1 != BTREE_RESULT_SUCCESS) break;
                            btreeblk_end(&bhandle);
                            k = k >> 0x38 | (k & 0xff000000000000) >> 0x28 |
                                (k & 0xff0000000000) >> 0x18 | (k & 0xff00000000) >> 8 |
                                (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
                                (k & 0xff00) << 0x28 | k << 0x38;
                            v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 |
                                (v & 0xff0000000000) >> 0x18 | (v & 0xff00000000) >> 8 |
                                (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
                                (v & 0xff00) << 0x28 | v << 0x38;
                            if (uVar2 != k) {
                              fprintf(_stderr,"Test failed: %s %d\n",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                     );
                              btree_reverse_iterator_test()::__test_pass = '\x01';
                              if (uVar2 != k) {
                                __assert_fail("k == (uint64_t)c",
                                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                              ,0x2e0,"void btree_reverse_iterator_test()");
                              }
                            }
                            if (uVar3 != v) {
                              fprintf(_stderr,"Test failed: %s %d\n",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                     );
                              btree_reverse_iterator_test()::__test_pass = '\x01';
                              if (uVar3 != v) {
                                __assert_fail("v == (uint64_t)c*0x10",
                                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                              ,0x2e1,"void btree_reverse_iterator_test()");
                              }
                            }
                            uVar2 = uVar2 - 0x10;
                            uVar3 = uVar3 - 0x100;
                          }
                          fprintf(_stderr,"Test failed: %s %d\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                  ,0x2dc);
                          btree_reverse_iterator_test()::__test_pass = 1;
                          __assert_fail("br == BTREE_RESULT_SUCCESS",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                        ,0x2dc,"void btree_reverse_iterator_test()");
                        }
                        bVar1 = btree_next(&bi,&k,&v);
                        if (bVar1 != BTREE_RESULT_SUCCESS) break;
                        btreeblk_end(&bhandle);
                        k = k >> 0x38 | (k & 0xff000000000000) >> 0x28 |
                            (k & 0xff0000000000) >> 0x18 | (k & 0xff00000000) >> 8 |
                            (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 | (k & 0xff00) << 0x28 |
                            k << 0x38;
                        v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 |
                            (v & 0xff0000000000) >> 0x18 | (v & 0xff00000000) >> 8 |
                            (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 | (v & 0xff00) << 0x28 |
                            v << 0x38;
                        if (uVar2 != k) {
                          fprintf(_stderr,"Test failed: %s %d\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                 );
                          btree_reverse_iterator_test()::__test_pass = '\x01';
                          if (uVar2 != k) {
                            __assert_fail("k == (uint64_t)c",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                          ,0x2d6,"void btree_reverse_iterator_test()");
                          }
                        }
                        if (uVar3 != v) {
                          fprintf(_stderr,"Test failed: %s %d\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                 );
                          btree_reverse_iterator_test()::__test_pass = '\x01';
                          if (uVar3 != v) {
                            __assert_fail("v == (uint64_t)c*0x10",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                          ,0x2d7,"void btree_reverse_iterator_test()");
                          }
                        }
                        uVar2 = uVar2 + 0x10;
                        uVar3 = uVar3 + 0x100;
                      }
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                              ,0x2d2);
                      btree_reverse_iterator_test()::__test_pass = 1;
                      __assert_fail("br == BTREE_RESULT_SUCCESS",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                    ,0x2d2,"void btree_reverse_iterator_test()");
                    }
                    bVar1 = btree_prev(&bi,&k,&v);
                    if (bVar1 != BTREE_RESULT_SUCCESS) break;
                    btreeblk_end(&bhandle);
                    k = k >> 0x38 | (k & 0xff000000000000) >> 0x28 | (k & 0xff0000000000) >> 0x18 |
                        (k & 0xff00000000) >> 8 | (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
                        (k & 0xff00) << 0x28 | k << 0x38;
                    v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
                        (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
                        (v & 0xff00) << 0x28 | v << 0x38;
                    if (uVar2 != k) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                             );
                      btree_reverse_iterator_test()::__test_pass = '\x01';
                      if (uVar2 != k) {
                        __assert_fail("k == (uint64_t)c",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                      ,0x2cc,"void btree_reverse_iterator_test()");
                      }
                    }
                    if (uVar3 != v) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                             );
                      btree_reverse_iterator_test()::__test_pass = '\x01';
                      if (uVar3 != v) {
                        __assert_fail("v == (uint64_t)c*0x10",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                      ,0x2cd,"void btree_reverse_iterator_test()");
                      }
                    }
                    uVar2 = uVar2 - 0x10;
                    uVar3 = uVar3 - 0x100;
                  }
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                          ,0x2c8);
                  btree_reverse_iterator_test()::__test_pass = 1;
                  __assert_fail("br == BTREE_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                ,0x2c8,"void btree_reverse_iterator_test()");
                }
                bVar1 = btree_next(&bi,&k,&v);
                if (bVar1 != BTREE_RESULT_SUCCESS) break;
                btreeblk_end(&bhandle);
                k = k >> 0x38 | (k & 0xff000000000000) >> 0x28 | (k & 0xff0000000000) >> 0x18 |
                    (k & 0xff00000000) >> 8 | (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
                    (k & 0xff00) << 0x28 | k << 0x38;
                v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
                    (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
                    (v & 0xff00) << 0x28 | v << 0x38;
                if (uVar2 != k) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                         );
                  btree_reverse_iterator_test()::__test_pass = '\x01';
                  if (uVar2 != k) {
                    __assert_fail("k == (uint64_t)c",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                  ,0x2c2,"void btree_reverse_iterator_test()");
                  }
                }
                if (uVar3 != v) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                         );
                  btree_reverse_iterator_test()::__test_pass = '\x01';
                  if (uVar3 != v) {
                    __assert_fail("v == (uint64_t)c*0x10",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                  ,0x2c3,"void btree_reverse_iterator_test()");
                  }
                }
                uVar2 = uVar2 + 0x10;
                uVar3 = uVar3 + 0x100;
              }
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                      ,0x2be);
              btree_reverse_iterator_test()::__test_pass = 1;
              __assert_fail("br == BTREE_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                            ,0x2be,"void btree_reverse_iterator_test()");
            }
            k = k >> 0x38 | (k & 0xff000000000000) >> 0x28 | (k & 0xff0000000000) >> 0x18 |
                (k & 0xff00000000) >> 8 | (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
                (k & 0xff00) << 0x28 | k << 0x38;
            v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
                (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
                (v & 0xff00) << 0x28 | v << 0x38;
            if (uVar2 != k) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                     );
              btree_reverse_iterator_test()::__test_pass = '\x01';
              if (uVar2 != k) {
                __assert_fail("k == (uint64_t)(0x17-c)*0x10",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                              ,0x2b1,"void btree_reverse_iterator_test()");
              }
            }
            if (uVar3 != v) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                     );
              btree_reverse_iterator_test()::__test_pass = '\x01';
              if (uVar3 != v) {
                __assert_fail("v == (uint64_t)(0x17-c)*0x100",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                              ,0x2b2,"void btree_reverse_iterator_test()");
              }
            }
            lVar4 = lVar4 + -1;
            uVar2 = uVar2 - 0x10;
            uVar3 = uVar3 - 0x100;
          } while( true );
        }
        k = k >> 0x38 | (k & 0xff000000000000) >> 0x28 | (k & 0xff0000000000) >> 0x18 |
            (k & 0xff00000000) >> 8 | (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
            (k & 0xff00) << 0x28 | k << 0x38;
        v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
            (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
            (v & 0xff00) << 0x28 | v << 0x38;
        if (uVar2 != k) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                 );
          btree_reverse_iterator_test()::__test_pass = '\x01';
          if (uVar2 != k) {
            __assert_fail("k == (uint64_t)(39-c)*0x10",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                          ,0x2a1,"void btree_reverse_iterator_test()");
          }
        }
        if (uVar3 != v) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                 );
          btree_reverse_iterator_test()::__test_pass = '\x01';
          if (uVar3 != v) {
            __assert_fail("v == (uint64_t)(39-c)*0x100",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                          ,0x2a2,"void btree_reverse_iterator_test()");
          }
        }
        lVar4 = lVar4 + -1;
        uVar2 = uVar2 - 0x10;
        uVar3 = uVar3 - 0x100;
      } while( true );
    }
    k = k >> 0x38 | (k & 0xff000000000000) >> 0x28 | (k & 0xff0000000000) >> 0x18 |
        (k & 0xff00000000) >> 8 | (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
        (k & 0xff00) << 0x28 | k << 0x38;
    v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
        (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
        (v & 0xff00) << 0x28 | v << 0x38;
    if (uVar2 != k) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
             );
      btree_reverse_iterator_test()::__test_pass = '\x01';
      if (uVar2 != k) {
        __assert_fail("k == (uint64_t)(c+10)*0x10",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                      ,0x278,"void btree_reverse_iterator_test()");
      }
    }
    if (uVar3 != v) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
             );
      btree_reverse_iterator_test()::__test_pass = '\x01';
      if (uVar3 != v) {
        __assert_fail("v == (uint64_t)(c+10)*0x100",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                      ,0x279,"void btree_reverse_iterator_test()");
      }
    }
    lVar4 = lVar4 + -1;
    uVar2 = uVar2 + 0x10;
    uVar3 = uVar3 + 0x100;
  } while( true );
}

Assistant:

void btree_reverse_iterator_test()
{
    TEST_INIT();

    int ksize = 8, vsize = 8, r, c;
    int nodesize = 256;
    struct filemgr *file;
    struct btreeblk_handle bhandle;
    struct btree btree;
    struct btree_iterator bi;
    struct filemgr_config config;
    struct btree_kv_ops *kv_ops;
    btree_result br;
    filemgr_open_result fr;
    uint64_t i;
    uint64_t k,v;
    char *fname = (char *) "./btreeblock_testfile";

    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;

    memleak_start();

    memset(&config, 0, sizeof(config));
    config.blocksize = nodesize;
    config.options = FILEMGR_CREATE;
    config.num_wal_shards = 8;
    fr = filemgr_open(fname, get_filemgr_ops(), &config, NULL);
    file = fr.file;

    btreeblk_init(&bhandle, file, nodesize);
    kv_ops = btree_kv_get_kb64_vb64(NULL);
    btree_init(&btree, (void*)&bhandle,
               btreeblk_get_ops(), kv_ops,
               nodesize, ksize, vsize, 0x0, NULL);

    for (i=10;i<40;++i) {
        k = _endian_encode(i*0x10);
        v = _endian_encode(i*0x100);
        btree_insert(&btree, (void*)&k, (void*)&v);
        btreeblk_end(&bhandle);
    }

    c = 0;
    btree_iterator_init(&btree, &bi, NULL);
    while ((br=btree_next(&bi, &k, &v)) == BTREE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)(c+10)*0x10);
        TEST_CHK(v == (uint64_t)(c+10)*0x100);
        c++;
    }
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    TEST_CHK(c == 30);

    c = 0;
    i=10000;
    k = _endian_encode(i);
    btree_iterator_init(&btree, &bi, &k);
    while ((br=btree_next(&bi, &k, &v)) == BTREE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
    }
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    TEST_CHK(c == 0);

    // reverse iteration with NULL initial key
    c = 0;
    btree_iterator_init(&btree, &bi, NULL);
    while ((br=btree_prev(&bi, &k, &v)) == BTREE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
    }
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    TEST_CHK(c == 0);

    c = 0;
    i=10000;
    k = _endian_encode(i);
    btree_iterator_init(&btree, &bi, &k);
    while ((br=btree_prev(&bi, &k, &v)) == BTREE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)(39-c)*0x10);
        TEST_CHK(v == (uint64_t)(39-c)*0x100);
        c++;
    }
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    TEST_CHK(c == 30);

    c = 0;
    i=0x175;
    k = _endian_encode(i);
    btree_iterator_init(&btree, &bi, &k);
    while ((br=btree_prev(&bi, &k, &v)) == BTREE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)(0x17-c)*0x10);
        TEST_CHK(v == (uint64_t)(0x17-c)*0x100);
        c++;
    }
    btreeblk_end(&bhandle);
    btree_iterator_free(&bi);
    TEST_CHK(c == 14);

    c = 0xa0 - 0x10;
    btree_iterator_init(&btree, &bi, NULL);
    for (i=0;i<15;++i){
        c += 0x10;
        br = btree_next(&bi, &k, &v);
        TEST_CHK(br == BTREE_RESULT_SUCCESS);
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)c);
        TEST_CHK(v == (uint64_t)c*0x10);
    }
    for (i=0;i<7;++i){
        c -= 0x10;
        br = btree_prev(&bi, &k, &v);
        TEST_CHK(br == BTREE_RESULT_SUCCESS);
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)c);
        TEST_CHK(v == (uint64_t)c*0x10);
    }
    for (i=0;i<10;++i){
        c += 0x10;
        br = btree_next(&bi, &k, &v);
        TEST_CHK(br == BTREE_RESULT_SUCCESS);
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)c);
        TEST_CHK(v == (uint64_t)c*0x10);
    }
    for (i=0;i<17;++i){
        c -= 0x10;
        br = btree_prev(&bi, &k, &v);
        TEST_CHK(br == BTREE_RESULT_SUCCESS);
        btreeblk_end(&bhandle);
        k = _endian_decode(k);
        v = _endian_decode(v);
        TEST_CHK(k == (uint64_t)c);
        TEST_CHK(v == (uint64_t)c*0x10);
    }
    br = btree_prev(&bi, &k, &v);
    btreeblk_end(&bhandle);
    TEST_CHK(br == BTREE_RESULT_FAIL);

    btree_iterator_free(&bi);

    free(kv_ops);
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    memleak_end();

    TEST_RESULT("btree reverse iterator test");
}